

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckDepth(BlitTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  float fVar6;
  GLfloat depth [2] [3];
  float local_1c8 [8];
  float local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[3] = 0.0;
  local_1c8[4] = 0.0;
  local_1c8[5] = 0.0;
  lVar5 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))(0,0,3,2,0x1902,0x1406,local_1c8);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb96);
  bVar2 = true;
  do {
    lVar4 = 0;
    do {
      fVar6 = CheckDepth::reference[lVar5][lVar4] - local_1c8[lVar5 * 3 + lVar4];
      local_1a8 = -fVar6;
      if (-fVar6 <= fVar6) {
        local_1a8 = fVar6;
      }
      if (0.015625 < local_1a8) {
        uStack_1a4 = 0x80000000;
        uStack_1a0 = 0x80000000;
        uStack_19c = 0x80000000;
        local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_198 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Blitted framebuffer depth buffer contains [",0x2b);
        std::ostream::_M_insert<double>((double)local_1c8[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)local_1c8[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)local_1c8[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::_M_insert<double>((double)local_1c8[3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)local_1c8[4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)local_1c8[5]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], but ",7);
        std::ostream::_M_insert<double>(0.5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.125);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::_M_insert<double>(0.0625);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.0625);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.0625);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] was expected.",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_120);
        goto LAB_00a919e0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar5 = 1;
    bVar1 = !bVar2;
    bVar2 = false;
    if (bVar1) {
LAB_00a919e0:
      return local_1a8 <= 0.015625;
    }
  } while( true );
}

Assistant:

bool BlitTest::CheckDepth()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3] = { { 0.5, 0.25, 0.125 }, { 0.0625, 0.0625, 0.0625 } };

	/* Copy buffer. */
	glw::GLfloat depth[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_DEPTH_COMPONENT, GL_FLOAT, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (de::abs(reference[j][i] - depth[j][i]) > (1.f / 64.f) /* Precision. */)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer depth buffer contains [" << depth[0][0] << ", "
					<< depth[0][1] << ", " << depth[0][2] << ", \n"
					<< depth[1][0] << ", " << depth[1][1] << ", " << depth[1][2] << "], but " << reference[0][0] << ", "
					<< reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}